

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::LoopUnrollCase::expressionTemplate_abi_cxx11_
          (string *__return_storage_ptr__,LoopUnrollCase *this,CaseType caseType)

{
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  CaseType caseType_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"value += sin(float(${NDX}+1)*valueOrig)",&local_15)
    ;
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"value = sin(value)",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)0x0,&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string expressionTemplate (CaseType caseType)
	{
		switch (caseType)
		{
			case CASETYPE_INDEPENDENT:	return "value += sin(float(${NDX}+1)*valueOrig)";
			case CASETYPE_DEPENDENT:	return "value = sin(value)";
			default:
				DE_ASSERT(false);
				return DE_NULL;
		}
	}